

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderBase.hpp
# Opt level: O0

void __thiscall
Diligent::ShaderBase<Diligent::EngineGLImplTraits>::~ShaderBase
          (ShaderBase<Diligent::EngineGLImplTraits> *this)

{
  bool bVar1;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  ShaderBase<Diligent::EngineGLImplTraits> *this_local;
  
  (this->
  super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>).
  super_ObjectBase<Diligent::IShaderGL>.super_RefCountedObject<Diligent::IShaderGL>.super_IShaderGL.
  super_IShader.super_IDeviceObject.super_IObject = (IObject)&PTR_QueryInterface_013a4f60;
  GetCompileTask((ShaderBase<Diligent::EngineGLImplTraits> *)((long)&msg.field_2 + 8));
  bVar1 = RefCntAutoPtr<Diligent::IAsyncTask>::operator!
                    ((RefCntAutoPtr<Diligent::IAsyncTask> *)((long)&msg.field_2 + 8));
  RefCntAutoPtr<Diligent::IAsyncTask>::~RefCntAutoPtr
            ((RefCntAutoPtr<Diligent::IAsyncTask> *)((long)&msg.field_2 + 8));
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    FormatString<char[117]>
              ((string *)local_38,
               (char (*) [117])
               "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"~ShaderBase",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderBase.hpp"
               ,0x99);
    std::__cxx11::string::~string((string *)local_38);
  }
  std::__cxx11::string::~string((string *)&this->m_CombinedSamplerSuffix);
  std::unique_ptr<Diligent::AsyncInitializer,_std::default_delete<Diligent::AsyncInitializer>_>::
  ~unique_ptr(&this->m_AsyncInitializer);
  DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>::
  ~DeviceObjectBase(&this->
                     super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                   );
  return;
}

Assistant:

~ShaderBase()
    {
        VERIFY(!GetCompileTask(), "Compile task is still running. This may result in a crash if the task accesses resources owned by the shader object.");
    }